

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::RepeatedFieldGenerator::RepeatedFieldGenerator
          (RepeatedFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  mapped_type *this_00;
  allocator local_41;
  key_type local_40;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  RepeatedFieldGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  ObjCObjFieldGenerator::ObjCObjFieldGenerator
            (&this->super_ObjCObjFieldGenerator,descriptor,options);
  (this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.super_FieldGenerator.
  _vptr_FieldGenerator = (_func_int **)&PTR__RepeatedFieldGenerator_006f7898;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"array_comment",&local_41);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&(this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.
                          super_FieldGenerator.variables_,&local_40);
  std::__cxx11::string::operator=((string *)this_00,"");
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

RepeatedFieldGenerator::RepeatedFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : ObjCObjFieldGenerator(descriptor, options) {
  // Default to no comment and let the cases needing it fill it in.
  variables_["array_comment"] = "";
}